

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topology.cpp
# Opt level: O3

void lume::FillGrobToIndexMap(GrobHashMap<GrobIndex> *indexMapInOut,Mesh *mesh,GrobSet grobSet)

{
  int iVar1;
  uint uVar2;
  _Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_> _Var3;
  index_t iVar4;
  int iVar5;
  ulong uVar6;
  index_t *globalCornerArray;
  long lVar7;
  int iVar8;
  __hashtable *__this;
  double dVar9;
  iterator __begin2;
  iterator __end2;
  GrobSet local_9c;
  Mesh *local_98;
  GrobIterator local_90;
  index_t *local_70;
  uint64_t local_68;
  uint local_60;
  undefined8 local_58;
  GrobIterator local_50;
  
  local_9c.m_offset = grobSet.m_offset;
  iVar4 = Mesh::num(mesh,&local_9c);
  dVar9 = ceil((double)iVar4 / (double)(indexMapInOut->_M_h)._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<lume::Grob,_std::pair<const_lume::Grob,_lume::GrobIndex>,_std::allocator<std::pair<const_lume::Grob,_lume::GrobIndex>_>,_std::__detail::_Select1st,_std::equal_to<lume::Grob>,_std::hash<lume::Grob>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&indexMapInOut->_M_h,
           (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9);
  iVar1 = *(int *)(impl::GROB_SET_DESCS + (ulong)(local_9c.m_offset + 2) * 4);
  if (iVar1 != 0) {
    iVar8 = 0;
    local_98 = mesh;
    do {
      uVar2 = *(uint *)(impl::GROB_SET_DESCS + (ulong)(local_9c.m_offset + iVar8 + 3) * 4);
      _Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl =
           mesh->m_grobArrays[uVar2]._M_t.
           super___uniq_ptr_impl<lume::GrobArray,_std::default_delete<lume::GrobArray>_>._M_t.
           super__Tuple_impl<0UL,_lume::GrobArray_*,_std::default_delete<lume::GrobArray>_>.
           super__Head_base<0UL,_lume::GrobArray_*,_false>;
      if (_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl != (GrobArray *)0x0) {
        globalCornerArray =
             *(index_t **)
              ((long)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl + 0x10);
        uVar6 = *(long *)((long)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl +
                         0x18) - (long)globalCornerArray;
        if (*(uint *)((long)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl +
                     0x28) <= (uint)(uVar6 >> 2)) {
          if ((uVar6 & 0x3fffffffc) == 0) {
            globalCornerArray = (index_t *)0x0;
          }
          GrobIterator::GrobIterator
                    (&local_90,
                     *(grob_t *)
                      (impl::GROB_DESCS +
                      (ulong)*(uint *)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>.
                                      _M_head_impl * 4),globalCornerArray);
          lVar7 = *(long *)((long)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl
                           + 0x10);
          uVar6 = *(long *)((long)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>._M_head_impl
                           + 0x18) - lVar7 & 0x3fffffffc;
          if (uVar6 == 0) {
            lVar7 = 0;
          }
          GrobIterator::GrobIterator
                    (&local_50,
                     *(grob_t *)
                      (impl::GROB_DESCS +
                      (ulong)*(uint *)_Var3.super__Head_base<0UL,_lume::GrobArray_*,_false>.
                                      _M_head_impl * 4),(index_t *)(lVar7 + uVar6));
          iVar5 = 0;
          while ((local_90.m_grob.m_globCornerInds != local_50.m_grob.m_globCornerInds ||
                 (mesh = local_98,
                 *(int *)(impl::GROB_DESCS + (ulong)local_90.m_grob.m_desc.m_offset * 4) !=
                 *(int *)(impl::GROB_DESCS + (ulong)local_50.m_grob.m_desc.m_offset * 4)))) {
            local_68 = local_90.m_grob.m_cornerOffsets.m_data;
            local_60 = local_90.m_grob.m_desc.m_offset;
            local_58 = CONCAT44(iVar5,uVar2);
            local_70 = local_90.m_grob.m_globCornerInds;
            std::
            _Hashtable<lume::Grob,std::pair<lume::Grob_const,lume::GrobIndex>,std::allocator<std::pair<lume::Grob_const,lume::GrobIndex>>,std::__detail::_Select1st,std::equal_to<lume::Grob>,std::hash<lume::Grob>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<lume::Grob,lume::GrobIndex>>
                      ((_Hashtable<lume::Grob,std::pair<lume::Grob_const,lume::GrobIndex>,std::allocator<std::pair<lume::Grob_const,lume::GrobIndex>>,std::__detail::_Select1st,std::equal_to<lume::Grob>,std::hash<lume::Grob>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)indexMapInOut,&local_70);
            local_90.m_grob.m_globCornerInds =
                 local_90.m_grob.m_globCornerInds + local_90.m_numCorners;
            iVar5 = iVar5 + 1;
          }
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar1);
  }
  return;
}

Assistant:

void FillGrobToIndexMap (GrobHashMap <GrobIndex>& indexMapInOut,
                       const Mesh& mesh,
                       const GrobSet grobSet)
{
	indexMapInOut.reserve (mesh.num (grobSet));
	
	for (auto grobType : grobSet) {
		if (!mesh.has (grobType))
			continue;
		
		index_t counter = 0;

		for(auto grob : mesh.grobs (grobType)) {
			indexMapInOut.insert (make_pair (grob, GrobIndex (grobType, counter++)));
		}
	}
}